

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O1

void __thiscall TPZMatrix<Fad<float>_>::Print(TPZMatrix<Fad<float>_> *this,ostream *out)

{
  string name;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "virtual void TPZMatrix<Fad<float>>::Print(std::ostream &) const [T = Fad<float>]","");
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1c])(this,local_40[0],out,0);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

virtual void Print(std::ostream &out) const 
    {
        std::string name = __PRETTY_FUNCTION__;
        Print(name.c_str(),out);
    }